

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputBufferPtr xmlParserInputBufferCreateFd(int fd,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  int *piVar2;
  
  if (-1 < fd) {
    pxVar1 = xmlAllocParserInputBuffer(enc);
    if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
      return (xmlParserInputBufferPtr)0x0;
    }
    piVar2 = (int *)(*xmlMalloc)(4);
    if (piVar2 != (int *)0x0) {
      *piVar2 = fd;
      pxVar1->context = piVar2;
      pxVar1->readcallback = xmlFdRead;
      pxVar1->closecallback = xmlFdFree;
      return pxVar1;
    }
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFd(int fd, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (fd < 0) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        xmlFdIOCtxt *fdctxt;

        fdctxt = xmlMalloc(sizeof(*fdctxt));
        if (fdctxt == NULL) {
            return(NULL);
        }
        fdctxt->fd = fd;

        ret->context = fdctxt;
	ret->readcallback = xmlFdRead;
        ret->closecallback = xmlFdFree;
    }

    return(ret);
}